

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<unsigned_int>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,uint *v)

{
  bool bVar1;
  value_type_conflict5 *pvVar2;
  optional<unsigned_int> local_5c;
  optional<unsigned_int> local_54;
  optional<unsigned_int> pv_1;
  optional<unsigned_int> local_40;
  optional<unsigned_int> pv;
  uint *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (uint *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002d480e;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv);
  if (bVar1) {
    get_default_value<unsigned_int>((optional<unsigned_int> *)&pv_1.contained,this);
    nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
              (&local_40,(optional<unsigned_int> *)&pv_1.contained);
    nonstd::optional_lite::optional<unsigned_int>::~optional
              ((optional<unsigned_int> *)&pv_1.contained);
    pv_1.has_value_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
    if (pv_1.has_value_) {
      pvVar2 = nonstd::optional_lite::optional<unsigned_int>::value(&local_40);
      *v = *pvVar2;
      this_local._7_1_ = 1;
    }
    pv_1._1_3_ = 0;
    nonstd::optional_lite::optional<unsigned_int>::~optional(&local_40);
    if (pv_1._0_4_ != 0) goto LAB_002d480e;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002d480e;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<unsigned_int,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<unsigned_int>(&local_5c,this);
      nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>(&local_54,&local_5c);
      nonstd::optional_lite::optional<unsigned_int>::~optional(&local_5c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_54);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<unsigned_int>::value(&local_54);
        *v = *pvVar2;
        this_local._7_1_ = 1;
      }
      pv_1._1_3_ = 0;
      pv_1.has_value_ = bVar1;
      nonstd::optional_lite::optional<unsigned_int>::~optional(&local_54);
      if (pv_1._0_4_ != 0) goto LAB_002d480e;
    }
    this_local._7_1_ = 0;
  }
LAB_002d480e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }